

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

bool __thiscall slang::ast::IntegralType::isDeclaredReg(IntegralType *this)

{
  bool bVar1;
  ScalarType *pSVar2;
  Type *in_RDI;
  Type *type;
  Type *local_18;
  bool local_1;
  
  local_18 = in_RDI;
  while ((local_18->super_Symbol).kind == PackedArrayType) {
    Symbol::as<slang::ast::PackedArrayType>((Symbol *)0x10de344);
    local_18 = Type::getCanonicalType(in_RDI);
  }
  bVar1 = Type::isScalar((Type *)0x10de35c);
  if (bVar1) {
    pSVar2 = Symbol::as<slang::ast::ScalarType>((Symbol *)0x10de36b);
    local_1 = pSVar2->scalarKind == Reg;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IntegralType::isDeclaredReg() const {
    const Type* type = this;
    while (type->kind == SymbolKind::PackedArrayType)
        type = &type->as<PackedArrayType>().elementType.getCanonicalType();

    if (type->isScalar())
        return type->as<ScalarType>().scalarKind == ScalarType::Reg;

    return false;
}